

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

void Abc_NtkSplitLarge(Abc_Ntk_t *pNtk,int nFaninsMax,int nCubesMax)

{
  uint uVar1;
  Abc_Obj_t *pNode;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                  ,0x1a8,"void Abc_NtkSplitLarge(Abc_Ntk_t *, int, int)");
  }
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    uVar1 = pNtk->vObjs->nSize;
    uVar4 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar3->pArray[uVar4];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        if (uVar1 == uVar4) {
          return;
        }
        iVar2 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
        if (nCubesMax < iVar2 || 1 < iVar2 && nFaninsMax < (pNode->vFanins).nSize) {
          Abc_NodeSplitLarge(pNode);
        }
      }
      uVar4 = uVar4 + 1;
      pVVar3 = pNtk->vObjs;
    } while ((long)uVar4 < (long)pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkSplitLarge( Abc_Ntk_t * pNtk, int nFaninsMax, int nCubesMax )
{
    Abc_Obj_t * pNode;
    int nObjOld = Abc_NtkObjNumMax(pNtk);
    int i, nCubes;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( i == nObjOld )
            break;
        nCubes = Abc_SopGetCubeNum((char *)pNode->pData);
        if ( (Abc_ObjFaninNum(pNode) > nFaninsMax && nCubes > 1) || nCubes > nCubesMax )
            Abc_NodeSplitLarge( pNode );
    }
}